

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O3

void anon_unknown.dwarf_8d1913::CheckUnparsable(string *prv,string *pub,string *expected_error)

{
  long lVar1;
  int iVar2;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar5;
  lazy_ostream local_390;
  undefined1 *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parse_pub;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parse_priv;
  string *local_2c0;
  assertion_result local_2b8;
  string **local_2a0;
  string *local_298;
  lazy_ostream local_290;
  undefined1 *local_280;
  string *local_278;
  char *local_270;
  char *local_268;
  assertion_result local_260;
  string error;
  FlatSigningProvider keys_pub;
  FlatSigningProvider keys_priv;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_013beda8;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_013beda8;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Parse(&parse_priv,prv,&keys_priv,&error,false);
  pvVar3 = (iterator)0x0;
  Parse(&parse_pub,pub,&keys_pub,&error,false);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x3a90b7;
  file.m_end = (iterator)0x1d;
  file.m_begin = (iterator)&local_300;
  msg.m_end = in_R9;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_310,msg);
  local_2b8.m_message.px = (element_type *)0x0;
  local_2b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290.m_empty = false;
  local_290._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013adf88;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_318 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  local_278 = prv;
  local_2b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (parse_priv.
        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       parse_priv.
       super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  boost::test_tools::tt_detail::report_assertion
            (&local_2b8,&local_290,1,1,WARN,_cVar5,(size_t)&local_320,0x1d);
  boost::detail::shared_count::~shared_count(&local_2b8.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x3a9165;
  file_00.m_end = (iterator)0x1e;
  file_00.m_begin = (iterator)&local_330;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_340,
             msg_00);
  local_2b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (parse_pub.
        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       parse_pub.
       super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_2b8.m_message.px = (element_type *)0x0;
  local_2b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290.m_empty = false;
  local_290._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013adf88;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_348 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  local_278 = pub;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b8,&local_290,1,1,WARN,_cVar5,(size_t)&local_350,0x1e);
  boost::detail::shared_count::~shared_count(&local_2b8.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1f;
  file_01.m_begin = (iterator)&local_360;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_370,
             msg_01);
  local_390.m_empty = false;
  local_390._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_380 = boost::unit_test::lazy_ostream::inst;
  local_378 = "";
  if (error._M_string_length == expected_error->_M_string_length) {
    if (error._M_string_length == 0) {
      local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar2 = bcmp(error._M_dataplus._M_p,(expected_error->_M_dataplus)._M_p,error._M_string_length)
      ;
      local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_298 = &error;
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_268 = "";
  local_278 = (string *)&local_298;
  local_290.m_empty = false;
  local_290._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae148;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = &local_2c0;
  local_2b8.m_message.px = (element_type *)((ulong)local_2b8.m_message.px & 0xffffffffffffff00);
  local_2b8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2c0 = expected_error;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,&local_390,1,2,REQUIRE,0x112cf10,(size_t)&local_270,0x1f,&local_290,
             "expected_error",&local_2b8);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(&parse_pub);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(&parse_priv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error._M_dataplus._M_p != &error.field_2) {
    operator_delete(error._M_dataplus._M_p,
                    CONCAT71(error.field_2._M_allocated_capacity._1_7_,error.field_2._M_local_buf[0]
                            ) + 1);
  }
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&keys_pub.tr_trees._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&keys_pub.keys._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&keys_pub.origins._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&keys_pub.pubkeys._M_t);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&keys_pub.scripts._M_t);
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&keys_priv.tr_trees._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&keys_priv.keys._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&keys_priv.origins._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&keys_priv.pubkeys._M_t);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&keys_priv.scripts._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckUnparsable(const std::string& prv, const std::string& pub, const std::string& expected_error)
{
    FlatSigningProvider keys_priv, keys_pub;
    std::string error;
    auto parse_priv = Parse(prv, keys_priv, error);
    auto parse_pub = Parse(pub, keys_pub, error);
    BOOST_CHECK_MESSAGE(parse_priv.empty(), prv);
    BOOST_CHECK_MESSAGE(parse_pub.empty(), pub);
    BOOST_CHECK_EQUAL(error, expected_error);
}